

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGenerator.cxx
# Opt level: O1

MessageLevel cmInstallGenerator::SelectMessageLevel(cmMakefile *mf,bool never)

{
  pointer pcVar1;
  int iVar2;
  string *psVar3;
  MessageLevel MVar4;
  undefined7 in_register_00000031;
  string m;
  long *local_58 [2];
  long local_48 [2];
  string local_38;
  
  MVar4 = MessageNever;
  if ((int)CONCAT71(in_register_00000031,never) == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"CMAKE_INSTALL_MESSAGE","");
    psVar3 = cmMakefile::GetSafeDefinition(mf,&local_38);
    pcVar1 = (psVar3->_M_dataplus)._M_p;
    local_58[0] = local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_58,pcVar1,pcVar1 + psVar3->_M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
    iVar2 = std::__cxx11::string::compare((char *)local_58);
    if (iVar2 == 0) {
      MVar4 = MessageAlways;
    }
    else {
      iVar2 = std::__cxx11::string::compare((char *)local_58);
      if (iVar2 == 0) {
        MVar4 = MessageLazy;
      }
      else {
        iVar2 = std::__cxx11::string::compare((char *)local_58);
        MVar4 = (uint)(iVar2 == 0) * 3;
      }
    }
    if (local_58[0] != local_48) {
      operator_delete(local_58[0],local_48[0] + 1);
    }
  }
  return MVar4;
}

Assistant:

cmInstallGenerator::MessageLevel cmInstallGenerator::SelectMessageLevel(
  cmMakefile* mf, bool never)
{
  if (never) {
    return MessageNever;
  }
  std::string m = mf->GetSafeDefinition("CMAKE_INSTALL_MESSAGE");
  if (m == "ALWAYS") {
    return MessageAlways;
  }
  if (m == "LAZY") {
    return MessageLazy;
  }
  if (m == "NEVER") {
    return MessageNever;
  }
  return MessageDefault;
}